

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O0

Vec_Int_t * Io_WriteAigerLiterals(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int local_2c;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  Vec_Int_t *vLits;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCoNum(pNtk);
  p = Vec_IntAlloc(iVar1);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar5 = Abc_NtkBox(pNtk,local_2c);
    iVar1 = Abc_ObjIsLatch(pAVar5);
    if (iVar1 != 0) {
      pAVar5 = Abc_NtkBox(pNtk,local_2c);
      pAVar5 = Abc_ObjFanin0(pAVar5);
      pAVar6 = Abc_ObjFanin0(pAVar5);
      uVar2 = Io_ObjAigerNum(pAVar6);
      uVar3 = Abc_ObjFaninC0(pAVar5);
      uVar4 = Io_ObjAigerNum(pAVar6);
      uVar2 = Io_ObjMakeLit(uVar2,uVar3 ^ uVar4 == 0);
      Vec_IntPush(p,uVar2);
    }
  }
  for (local_2c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar5 = Abc_NtkPo(pNtk,local_2c);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    uVar2 = Io_ObjAigerNum(pAVar6);
    uVar3 = Abc_ObjFaninC0(pAVar5);
    uVar4 = Io_ObjAigerNum(pAVar6);
    uVar2 = Io_ObjMakeLit(uVar2,uVar3 ^ uVar4 == 0);
    Vec_IntPush(p,uVar2);
  }
  return p;
}

Assistant:

Vec_Int_t * Io_WriteAigerLiterals( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        Vec_IntPush( vLits, Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        Vec_IntPush( vLits, Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}